

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
MatchAndExplain<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  ostream *poVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  const_iterator it;
  pointer elem;
  
  bVar1 = std::operator==(lhs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  if ((!bVar1) && (os = listener->stream_, os != (ostream *)0x0)) {
    bVar5 = false;
    for (elem = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; _Var2._M_current = *(unsigned_long **)this,
        elem != (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish; elem = elem + 1) {
      _Var2 = ArrayAwareFind<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                        (_Var2,*(unsigned_long **)(this + 8),elem);
      if (_Var2._M_current == *(unsigned_long **)(this + 8)) {
        pcVar6 = "which has these unexpected elements: ";
        if (bVar5) {
          pcVar6 = ", ";
        }
        else {
          bVar5 = true;
        }
        std::operator<<(os,pcVar6);
        internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
        PrintValue<unsigned_long,void,std::ostream&>(elem,os);
      }
    }
    pcVar6 = "which";
    if (bVar5) {
      pcVar6 = ",\nand";
    }
    bVar5 = false;
    for (; _Var2._M_current != *(unsigned_long **)(this + 8);
        _Var2._M_current = _Var2._M_current + 1) {
      _Var3 = ArrayAwareFind<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish,_Var2._M_current);
      if (_Var3._M_current ==
          (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        if (bVar5) {
          pcVar7 = ", ";
          poVar4 = os;
        }
        else {
          poVar4 = std::operator<<(os,pcVar6);
          pcVar7 = " doesn\'t have these expected elements: ";
        }
        std::operator<<(poVar4,pcVar7);
        internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
        PrintValue<unsigned_long,void,std::ostream&>(_Var2._M_current,os);
        bVar5 = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }